

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O3

bool __thiscall PatternSelection::contains(PatternSelection *this,PatternAnchor cursor)

{
  bool bVar1;
  int iVar2;
  Iterator iter;
  Iterator local_30;
  
  iterator(&local_30,this);
  if (cursor.super_PatternCursorBase.row < local_30.mStart.super_PatternCursorBase.row) {
    bVar1 = false;
  }
  else {
    iVar2 = cursor.super_PatternCursorBase.column + cursor.super_PatternCursorBase.track * 5;
    bVar1 = iVar2 <= local_30.mEnd.super_PatternCursorBase.track * 5 +
                     local_30.mEnd.super_PatternCursorBase.column &&
            (local_30.mStart.super_PatternCursorBase.track * 5 +
             local_30.mStart.super_PatternCursorBase.column <= iVar2 &&
            cursor.super_PatternCursorBase.row <= local_30.mEnd.super_PatternCursorBase.row);
  }
  return bVar1;
}

Assistant:

bool PatternSelection::contains(PatternAnchor cursor) {
    auto iter = iterator();
    auto start = iter.trackStart() * PatternAnchor::MAX_SELECTS + iter.columnStart();
    auto end = iter.trackEnd() * PatternAnchor::MAX_SELECTS + iter.columnEnd();
    auto cursorColumn = cursor.track * PatternAnchor::MAX_SELECTS + cursor.column;
    return cursor.row >= iter.rowStart() && cursor.row <= iter.rowEnd() &&
           cursorColumn >= start && cursorColumn <= end;
}